

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O3

void __thiscall Varnode::saveXml(Varnode *this,ostream *s)

{
  AddrSpace *pAVar1;
  uint uVar2;
  ostream *poVar3;
  char local_49;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<addr",5);
  pAVar1 = (this->loc).base;
  (*pAVar1->_vptr_AddrSpace[8])(pAVar1,s,(this->loc).offset,(ulong)(uint)this->size);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ref","");
  local_49 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_49,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"0x",4);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (this->mergegroup != 0) {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"grp","");
    local_49 = ' ';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_49,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_48,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=\"",2);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
  }
  uVar2 = this->flags;
  if ((short)uVar2 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s," persists=\"true\"",0x10);
    uVar2 = this->flags;
  }
  if ((~uVar2 & 0x10020) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s," addrtied=\"true\"",0x10);
    uVar2 = this->flags;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s," unaff=\"true\"",0xd);
    uVar2 = this->flags;
  }
  if ((uVar2 & 8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(s," input=\"true\"",0xd);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"/>",2);
  return;
}

Assistant:

void Varnode::saveXml(ostream &s) const

{
  s << "<addr";
  loc.getSpace()->saveXmlAttributes(s,loc.getOffset(),size);
  a_v_u(s,"ref",getCreateIndex());
  if (mergegroup != 0)
    a_v_i(s,"grp",getMergeGroup());
  if (isPersist())
    s << " persists=\"true\"";
  if (isAddrTied())
    s << " addrtied=\"true\"";
  if (isUnaffected())
    s << " unaff=\"true\"";
  if (isInput())
    s << " input=\"true\"";
  s << "/>";
}